

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_calcImageSize_ImageSizeAtEachLevelRGBA2D_Test::TestBody
          (ktxTexture_calcImageSize_ImageSizeAtEachLevelRGBA2D_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ktx_size_t imageSize;
  ktx_uint32_t i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t ktx2sizes [5];
  ktx_uint32_t ktx1sizes [5];
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe78) [28];
  AssertionResult *in_stack_fffffffffffffe80;
  ktx_error_code_e *in_stack_fffffffffffffe88;
  Message *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_140 [2];
  char *in_stack_fffffffffffffee0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint uVar2;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar3;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_c0 [3];
  undefined4 local_8c;
  AssertionResult local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 local_40 [32];
  uint local_20;
  long local_10 [2];
  
  local_10[0] = 0;
  TestCreateInfo::TestCreateInfo((TestCreateInfo *)0x13f4f8);
  local_58 = 0x10000000400;
  local_50 = 0x1000000040;
  local_48 = 4;
  local_78 = 0x10000000400;
  local_70 = 0x1000000040;
  local_68 = 4;
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_8c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (ktx_error_code_e *)in_stack_fffffffffffffe80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13f5d6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,(Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,
               (Message *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x13f633);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f6a1);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe80,(bool *)in_stack_fffffffffffffe78,(type *)0x13f6cf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea0 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe98 = (char *)ktxErrorString(local_44);
    in_stack_fffffffffffffe90 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8._M_head_impl,
               in_stack_fffffffffffffee0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,(Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff00,
               (Message *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    testing::Message::~Message((Message *)0x13f7f3);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f8a0);
  if (uVar2 == 0) {
    uVar3 = 0;
    for (uVar2 = 0; uVar2 < local_20; uVar2 = uVar2 + 1) {
      ktxTexture_calcImageSize(local_10[0],uVar2,1);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
                 (unsigned_long *)in_stack_fffffffffffffe88,(uint *)in_stack_fffffffffffffe80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffee0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffe88 =
             (ktx_error_code_e *)
             testing::AssertionResult::failure_message((AssertionResult *)0x13f95f);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffeb0,(Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   (char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe90);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff00,(Message *)CONCAT44(uVar3,uVar2));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
        testing::Message::~Message((Message *)0x13f9ad);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fa12);
      ktxTexture_calcImageSize(local_10[0],uVar2,2);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
                 (unsigned_long *)in_stack_fffffffffffffe88,(uint *)in_stack_fffffffffffffe80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffe80 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x13fa9d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffeb0,(Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   (char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe90);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff00,(Message *)CONCAT44(uVar3,uVar2));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
        testing::Message::~Message((Message *)0x13faeb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fb4d);
    }
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_calcImageSize, ImageSizeAtEachLevelRGBA2D) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    // Sizes for 16x16, 5 level RGBA8 texture.
    // level 0 ... level 4
    ktx_uint32_t ktx1sizes[] = {1024, 256, 64, 16, 4};
    ktx_uint32_t ktx2sizes[] = {1024, 256, 64, 16, 4};

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_ONE);
        EXPECT_EQ(imageSize, ktx1sizes[i]);
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_TWO);
        EXPECT_EQ(imageSize, ktx2sizes[i]);
    }
    if (texture)
        ktxTexture_Destroy(texture);
}